

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Texture.cpp
# Opt level: O0

uint sf::Texture::getMaximumSize(void)

{
  TransientContextLock transientLock;
  Lock lock;
  undefined4 in_stack_ffffffffffffffe0;
  uint uVar1;
  undefined4 in_stack_ffffffffffffffe4;
  Mutex *in_stack_ffffffffffffffe8;
  TransientContextLock *in_stack_fffffffffffffff0;
  
  Lock::Lock((Lock *)in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8);
  if ((getMaximumSize::checked & 1U) == 0) {
    getMaximumSize::checked = true;
    GlResource::TransientContextLock::TransientContextLock(in_stack_fffffffffffffff0);
    priv::ensureExtensionsInit();
    (*sf_glad_glGetIntegerv)(0xd33,&getMaximumSize::size);
    GlResource::TransientContextLock::~TransientContextLock
              ((TransientContextLock *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0)
              );
  }
  uVar1 = getMaximumSize::size;
  Lock::~Lock((Lock *)CONCAT44(in_stack_ffffffffffffffe4,getMaximumSize::size));
  return uVar1;
}

Assistant:

unsigned int Texture::getMaximumSize()
{
    Lock lock(TextureImpl::maximumSizeMutex);

    static bool checked = false;
    static GLint size = 0;

    if (!checked)
    {
        checked = true;

        TransientContextLock transientLock;

        // Make sure that extensions are initialized
        sf::priv::ensureExtensionsInit();

        glCheck(glGetIntegerv(GL_MAX_TEXTURE_SIZE, &size));
    }

    return static_cast<unsigned int>(size);
}